

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall IR::CharLiteral::~CharLiteral(CharLiteral *this)

{
  CharLiteral *this_local;
  
  ~CharLiteral(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

const std::string& value() const { return std::get<0>(*this); }